

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

size_t cm_strverscmp_count_leading_zeros(char *s,size_t b)

{
  int iVar1;
  bool bVar2;
  size_t local_20;
  size_t i;
  size_t b_local;
  char *s_local;
  
  local_20 = b;
  while( true ) {
    bVar2 = false;
    if (s[local_20] == '0') {
      iVar1 = isdigit((int)s[local_20 + 1]);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    local_20 = local_20 + 1;
  }
  return local_20 - b;
}

Assistant:

static size_t cm_strverscmp_count_leading_zeros(const char* s, size_t b)
{
  size_t i = b;
  /* Step forward over zeros that are followed by another digit.  */
  while (s[i] == '0' && isdigit(s[i + 1])) {
    ++i;
  }
  return i - b;
}